

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_value * VmExtractMemObj(jx9_vm *pVm,SyString *pName,int bDup,int bCreate)

{
  VmFrame *pVVar1;
  void *pvVar2;
  sxi32 sVar3;
  SyHashEntry_Pr *pSVar4;
  char *pKey;
  sxu32 nKeyLen;
  byte bVar5;
  jx9_value *pjVar6;
  VmSlot sLocal;
  uint local_4c;
  SyHash *local_48;
  uint local_40 [2];
  undefined8 local_38;
  
  if ((pName == (SyString *)0x0) || (nKeyLen = pName->nByte, nKeyLen == 0)) {
    pName = &VmExtractMemObj::sAnnon;
    bVar5 = 1;
    bDup = 0;
    nKeyLen = 1;
  }
  else {
    bVar5 = 0;
  }
  pVVar1 = pVm->pFrame;
  if ((pVm->hSuper).nEntry != 0) {
    pSVar4 = HashGetEntry(&pVm->hSuper,pName->zString,nKeyLen);
    if (pSVar4 != (SyHashEntry_Pr *)0x0) {
      if ((pVm->aMemObj).nUsed <= *(uint *)&pSVar4->pUserData) {
        return (jx9_value *)0x0;
      }
      return (jx9_value *)
             ((ulong)(*(uint *)&pSVar4->pUserData * (pVm->aMemObj).eSize) +
             (long)(pVm->aMemObj).pBase);
    }
    nKeyLen = pName->nByte;
  }
  local_48 = &pVVar1->hVar;
  if (((nKeyLen == 0) || ((pVVar1->hVar).nEntry == 0)) ||
     (pSVar4 = HashGetEntry(local_48,pName->zString,nKeyLen), pSVar4 == (SyHashEntry_Pr *)0x0)) {
    if (bCreate != 0) {
      pKey = pName->zString;
      pjVar6 = jx9VmReserveMemObj(pVm,&local_4c);
      if ((pjVar6 != (jx9_value *)0x0) &&
         ((bDup == 0 ||
          (pKey = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte),
          pKey != (char *)0x0)))) {
        sVar3 = SyHashInsert(local_48,pKey,pName->nByte,(void *)(ulong)local_4c);
        if (sVar3 == 0) {
          if (pVVar1->pParent != (VmFrame *)0x0) {
            local_40[0] = local_4c;
            SySetPut(&pVVar1->sLocal,local_40);
            return pjVar6;
          }
          return pjVar6;
        }
        local_40[0] = local_4c;
        local_38 = 0;
        SySetPut(&pVm->aFreeObj,local_40);
      }
    }
  }
  else if (*(uint *)&pSVar4->pUserData < (pVm->aMemObj).nUsed) {
    pvVar2 = (pVm->aMemObj).pBase;
    pjVar6 = (jx9_value *)
             ((ulong)(*(uint *)&pSVar4->pUserData * (pVm->aMemObj).eSize) + (long)pvVar2);
    if ((bool)(bVar5 & pvVar2 != (void *)0x0)) {
      jx9MemObjRelease(pjVar6);
      return pjVar6;
    }
    return pjVar6;
  }
  return (jx9_value *)0x0;
}

Assistant:

static jx9_value * VmExtractMemObj(
	jx9_vm *pVm,           /* Target VM */
	const SyString *pName, /* Variable name */
	int bDup,              /* True to duplicate variable name */
	int bCreate            /* True to create the variable if non-existent */
	)
{
	int bNullify = FALSE;
	SyHashEntry *pEntry;
	VmFrame *pFrame;
	jx9_value *pObj;
	sxu32 nIdx;
	sxi32 rc;
	/* Point to the top active frame */
	pFrame = pVm->pFrame;
	/* Perform the lookup */
	if( pName == 0 || pName->nByte < 1 ){
		static const SyString sAnnon = { " " , sizeof(char) };
		pName = &sAnnon;
		/* Always nullify the object */
		bNullify = TRUE;
		bDup = FALSE;
	}
	/* Check the superglobals table first */
	pEntry = SyHashGet(&pVm->hSuper, (const void *)pName->zString, pName->nByte);
	if( pEntry == 0 ){
		/* Query the top active frame */
		pEntry = SyHashGet(&pFrame->hVar, (const void *)pName->zString, pName->nByte);
		if( pEntry == 0 ){
			char *zName = (char *)pName->zString;
			VmSlot sLocal;
			if( !bCreate ){
				/* Do not create the variable, return NULL */
				return 0;
			}
			/* No such variable, automatically create a new one and install
			 * it in the current frame.
			 */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				return 0;
			}
			if( bDup ){
				/* Duplicate name */
				zName = SyMemBackendStrDup(&pVm->sAllocator, pName->zString, pName->nByte);
				if( zName == 0 ){
					return 0;
				}
			}
			/* Link to the top active VM frame */
			rc = SyHashInsert(&pFrame->hVar, zName, pName->nByte, SX_INT_TO_PTR(nIdx));
			if( rc != SXRET_OK ){
				/* Return the slot to the free pool */
				sLocal.nIdx = nIdx;
				sLocal.pUserData = 0;
				SySetPut(&pVm->aFreeObj, (const void *)&sLocal);
				return 0;
			}
			if( pFrame->pParent != 0 ){
				/* Local variable */
				sLocal.nIdx = nIdx;
				SySetPut(&pFrame->sLocal, (const void *)&sLocal);
			}
		}else{
			/* Extract variable contents */
			nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( bNullify && pObj ){
				jx9MemObjRelease(pObj);
			}
		}
	}else{
		/* Superglobal */
		nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
		pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
	}
	return pObj;
}